

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ResultBuilder::captureExpectedException
          (ResultBuilder *this,
          Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *matcher)

{
  int iVar1;
  string actualMessage;
  AssertionResultData data;
  AssertionResult result;
  string asStack_138 [32];
  AssertionResultData local_118;
  AssertionResult local_d0;
  
  if ((this->m_exprComponents).testFalse == false) {
    AssertionResultData::AssertionResultData(&local_118,&this->m_data);
    local_118.resultType = Ok;
    std::__cxx11::string::_M_assign((string *)&local_118);
    translateActiveException_abi_cxx11_();
    iVar1 = (*(matcher->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
              _vptr_NonCopyable[5])(matcher,asStack_138);
    if ((char)iVar1 == '\0') {
      local_118.resultType = ExpressionFailed;
      std::__cxx11::string::_M_assign((string *)&local_118);
    }
    AssertionResult::AssertionResult(&local_d0,&this->m_assertionInfo,&local_118);
    handleResult(this,&local_d0);
    AssertionResult::~AssertionResult(&local_d0);
    std::__cxx11::string::~string(asStack_138);
    AssertionResultData::~AssertionResultData(&local_118);
    return;
  }
  __assert_fail("m_exprComponents.testFalse == false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AxelStrem[P]local_ptr/test/catch.hpp"
                ,0x2053,
                "void Catch::ResultBuilder::captureExpectedException(const Matchers::Impl::Matcher<std::string> &)"
               );
}

Assistant:

void ResultBuilder::captureExpectedException( Matchers::Impl::Matcher<std::string> const& matcher ) {

        assert( m_exprComponents.testFalse == false );
        AssertionResultData data = m_data;
        data.resultType = ResultWas::Ok;
        data.reconstructedExpression = m_assertionInfo.capturedExpression;

        std::string actualMessage = Catch::translateActiveException();
        if( !matcher.match( actualMessage ) ) {
            data.resultType = ResultWas::ExpressionFailed;
            data.reconstructedExpression = actualMessage;
        }
        AssertionResult result( m_assertionInfo, data );
        handleResult( result );
    }